

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Data.cpp
# Opt level: O0

bool __thiscall SRUP_MSG_DATA::data_ID(SRUP_MSG_DATA *this,uint8_t *data_ID,uint16_t len)

{
  uint8_t *puVar1;
  uint16_t len_local;
  uint8_t *data_ID_local;
  SRUP_MSG_DATA *this_local;
  
  (this->super_SRUP_MSG).m_is_serialized = false;
  if (this->m_data_ID != (uint8_t *)0x0) {
    operator_delete__(this->m_data_ID);
  }
  puVar1 = (uint8_t *)operator_new__((long)(int)(len + 1));
  this->m_data_ID = puVar1;
  memcpy(this->m_data_ID,data_ID,(ulong)len);
  memset(this->m_data_ID + (int)(uint)len,0,1);
  this->m_data_ID_len = len;
  return true;
}

Assistant:

bool SRUP_MSG_DATA::data_ID(const uint8_t *data_ID, const uint16_t len)
{
    m_is_serialized = false;

    delete[] m_data_ID;

    m_data_ID = new uint8_t[len+1];
    std::memcpy(m_data_ID, data_ID, len);
    std::memset(m_data_ID+len, 0, 1);
    m_data_ID_len = len;
    return true;
}